

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O1

void __thiscall
pbrt::
Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
::~Array2D(Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
           *this)

{
  void *pvVar1;
  memory_resource *pmVar2;
  long lVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (this->extent).pMax.super_Tuple2<pbrt::Point2,_int>;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (this->extent).pMin.super_Tuple2<pbrt::Point2,_int>;
  auVar6 = vpsubd_avx(auVar5,auVar6);
  auVar5 = vpshufd_avx(auVar6,0x55);
  auVar5 = vpmulld_avx(auVar5,auVar6);
  uVar4 = auVar5._0_4_;
  if (0 < (int)uVar4) {
    lVar3 = 0;
    do {
      pvVar1 = *(void **)((long)&(this->values->
                                 super__Vector_base<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + lVar3);
      if (pvVar1 != (void *)0x0) {
        operator_delete(pvVar1,*(long *)((long)&(this->values->
                                                super__Vector_base<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                                                )._M_impl.super__Vector_impl_data._M_end_of_storage
                                        + lVar3) - (long)pvVar1);
      }
      lVar3 = lVar3 + 0x18;
    } while ((ulong)uVar4 * 0x18 != lVar3);
  }
  pmVar2 = (this->allocator).memoryResource;
  (*pmVar2->_vptr_memory_resource[3])(pmVar2,this->values,(long)(int)uVar4 * 0x18,8);
  return;
}

Assistant:

~Array2D() {
        int n = extent.Area();
        for (int i = 0; i < n; ++i)
            allocator.destroy(values + i);
        allocator.deallocate_object(values, n);
    }